

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDPF.cpp
# Opt level: O0

void __thiscall EDPF::EDPF(EDPF *this,ED *obj)

{
  Size_<int> local_60;
  _OutputArray local_58;
  _InputArray local_30;
  ED *local_18;
  ED *obj_local;
  EDPF *this_local;
  
  local_18 = obj;
  obj_local = &this->super_ED;
  ED::ED(&this->super_ED,obj);
  (this->super_ED).sigma = (this->super_ED).sigma / 2.5;
  cv::_InputArray::_InputArray(&local_30,&(this->super_ED).srcImage);
  cv::_OutputArray::_OutputArray(&local_58,&(this->super_ED).smoothImage);
  cv::Size_<int>::Size_(&local_60);
  cv::GaussianBlur((this->super_ED).sigma,0,&local_30,&local_58,&local_60,4);
  cv::_OutputArray::~_OutputArray(&local_58);
  cv::_InputArray::~_InputArray(&local_30);
  validateEdgeSegments(this);
  return;
}

Assistant:

EDPF::EDPF(ED obj)
	:ED(obj)
{
	// Validate Edge Segments
	sigma /= 2.5;
	GaussianBlur(srcImage, smoothImage, Size(), sigma); // calculate kernel from sigma

	validateEdgeSegments();
}